

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O3

bool __thiscall Clasp::Asp::LogicProgram::isFact(LogicProgram *this,PrgAtom *a)

{
  PrgBody *pPVar1;
  bool bVar2;
  Id_t IVar3;
  ulong uVar4;
  long lVar5;
  PrgNode PVar6;
  uint uVar7;
  
  IVar3 = getEqNode<bk_lib::pod_vector<Clasp::Asp::PrgAtom*,std::allocator<Clasp::Asp::PrgAtom*>>const>
                    (this,&this->atoms_,
                     *(uint *)&(a->super_PrgHead).super_PrgNode.field_0x4 & 0xfffffff);
  if (((this->atomState_).state_.ebo_.size <= IVar3) ||
     (bVar2 = true, ((this->atomState_).state_.ebo_.buf[IVar3] & 0x20) == 0)) {
    if ((((ulong)(a->super_PrgHead).super_PrgNode & 0x3000000000000000) == 0x1000000000000000) &&
       (uVar4 = (ulong)(a->super_PrgHead).supports_.ebo_.size, uVar4 != 0)) {
      lVar5 = 0;
      do {
        uVar7 = *(uint *)((long)&((a->super_PrgHead).supports_.ebo_.buf)->rep + lVar5);
        if ((uVar7 & 0xe) == 4) {
          pPVar1 = (this->bodies_).ebo_.buf[uVar7 >> 4];
          uVar7 = *(uint *)&pPVar1->field_0x8 & 0x18000000;
          if (uVar7 == 0x8000000) {
            PVar6 = pPVar1[1].super_PrgNode;
LAB_0013f37b:
            uVar7 = *(uint *)PVar6;
          }
          else {
            if (uVar7 != 0) {
              PVar6 = (PrgNode)(pPVar1 + 1);
              goto LAB_0013f37b;
            }
            uVar7 = *(uint *)&pPVar1->field_0x8 & 0x1ffffff;
          }
          if (uVar7 == 0) {
            return true;
          }
        }
        lVar5 = lVar5 + 4;
      } while (uVar4 << 2 != lVar5);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool LogicProgram::isFact(PrgAtom* a) const {
	uint32 eqId = getRootId(a->id());
	if (atomState_.isFact(eqId)) {
		return true;
	}
	if (a->value() == value_true) {
		for (PrgAtom::sup_iterator it = a->supps_begin(), end = a->supps_end(); it != end; ++it) {
			if (it->isBody() && it->isNormal() && getBody(it->node())->bound() == 0) {
				return true;
			}
		}
	}
	return false;
}